

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

int64_t __thiscall LLVMBC::APInt::getSExtValue(APInt *this)

{
  uint32_t uVar1;
  IntegerType *this_00;
  ulong uVar2;
  ulong local_48;
  uint64_t extended;
  bool sign_bit;
  unsigned_long_long mask;
  uint32_t width;
  APInt *this_local;
  
  this_00 = cast<LLVMBC::IntegerType>(this->type);
  uVar1 = IntegerType::getBitWidth(this_00);
  if (uVar1 == 0x40) {
    this_local = (APInt *)this->value;
  }
  else {
    uVar2 = (1L << ((byte)uVar1 & 0x3f)) - 1;
    if ((this->value >> ((byte)uVar1 - 1 & 0x3f) & 1) == 0) {
      local_48 = 0;
    }
    else {
      local_48 = uVar2 ^ 0xffffffffffffffff;
    }
    this_local = (APInt *)(this->value & uVar2 | local_48);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t APInt::getSExtValue() const
{
	auto width = cast<IntegerType>(type)->getBitWidth();
	if (width == 64)
		return int64_t(value);
	auto mask = (1ull << width) - 1;
	bool sign_bit = ((value >> (width - 1)) & 1) != 0;
	uint64_t extended = sign_bit ? ~mask : 0ull;
	return int64_t((value & mask) | extended);
}